

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O3

tnt_error tnt_io_xbufmax(tnt_stream_net *s,int opt,int min)

{
  int iVar1;
  tnt_error tVar2;
  undefined8 in_RAX;
  int iVar3;
  int iVar4;
  undefined8 uStack_38;
  
  tVar2 = (tnt_error)in_RAX;
  iVar3 = 0x4000;
  if (min != 0) {
    iVar3 = min;
  }
  if (iVar3 < 0x8000001) {
    iVar4 = 0x8000000;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT44((uint)(iVar3 + iVar4) >> 1,(undefined4)uStack_38);
      tVar2 = setsockopt(s->fd,1,opt,(void *)((long)&uStack_38 + 4),4);
      iVar1 = uStack_38._4_4_ + -1;
      if (tVar2 == TNT_EOK) {
        iVar1 = iVar4;
        iVar3 = uStack_38._4_4_ + 1;
      }
      iVar4 = iVar1;
    } while (iVar3 <= iVar4);
  }
  return tVar2;
}

Assistant:

static enum tnt_error tnt_io_xbufmax(struct tnt_stream_net *s, int opt, int min) {
	int max = 128 * 1024 * 1024;
	if (min == 0)
		min = 16384;
	unsigned int avg = 0;
	while (min <= max) {
		avg = ((unsigned int)(min + max)) / 2;
		if (setsockopt(s->fd, SOL_SOCKET, opt, &avg, sizeof(avg)) == 0)
			min = avg + 1;
		else
			max = avg - 1;
	}
	return TNT_EOK;
}